

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O0

Complex * __thiscall Complex::getName_abi_cxx11_(Complex *this)

{
  string *in_RSI;
  Complex *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string Complex::getName() const
{
	return name;
}